

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O0

void cupdlp_diffDotDiff(CUPDLPwork *w,cupdlp_float *x1,cupdlp_float *x2,cupdlp_float *y1,
                       cupdlp_float *y2,cupdlp_int len,cupdlp_float *res)

{
  CUPDLPwork *in_RCX;
  void *in_RSI;
  long in_RDI;
  undefined8 in_R8;
  int in_R9D;
  cupdlp_float alpha;
  cupdlp_float *x;
  undefined4 in_stack_ffffffffffffffd0;
  cupdlp_int n;
  
  n = (cupdlp_int)((ulong)in_R8 >> 0x20);
  memcpy(*(void **)(in_RDI + 0x40),in_RSI,(long)in_R9D << 3);
  x = (cupdlp_float *)0xbff0000000000000;
  cupdlp_axpy(in_RCX,n,(cupdlp_float *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
              (cupdlp_float *)0xbff0000000000000,(cupdlp_float *)0x7fb74f);
  memcpy(*(void **)(in_RDI + 0x48),in_RCX,(long)in_R9D << 3);
  cupdlp_axpy(in_RCX,n,(cupdlp_float *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),x,
              (cupdlp_float *)0x7fb78a);
  cupdlp_dot(in_RCX,n,(cupdlp_float *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),x,
             (cupdlp_float *)0x7fb7af);
  return;
}

Assistant:

void cupdlp_diffDotDiff(CUPDLPwork *w, const cupdlp_float *x1,
                        const cupdlp_float *x2, const cupdlp_float *y1,
                        const cupdlp_float *y2, const cupdlp_int len,
                        cupdlp_float *res) {
  CUPDLP_COPY_VEC(w->buffer2, x1, cupdlp_float, len);
  cupdlp_float alpha = -1.0;
  cupdlp_axpy(w, len, &alpha, x2, w->buffer2);
  CUPDLP_COPY_VEC(w->buffer3, y1, cupdlp_float, len);
  cupdlp_axpy(w, len, &alpha, y2, w->buffer3);
  // reduce step
  cupdlp_dot(w, len, w->buffer2, w->buffer3, res);
}